

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  ImGuiColumns *__src;
  int iVar1;
  ImGuiColumns *pIVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ImGuiColumns IStack_a8;
  
  iVar1 = (window->ColumnsStorage).Size;
  if (0 < (long)iVar1) {
    pIVar2 = (window->ColumnsStorage).Data;
    lVar4 = 0;
    iVar3 = 0;
    do {
      if (*(ImGuiID *)((long)&pIVar2->ID + lVar4) == id) {
        if (iVar1 <= iVar3) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          pIVar2 = (window->ColumnsStorage).Data;
        }
        return (ImGuiColumns *)((long)&pIVar2->ID + lVar4);
      }
      iVar3 = iVar3 + 1;
      lVar4 = lVar4 + 0x88;
    } while ((long)iVar1 * 0x88 != lVar4);
  }
  ImGuiColumns::ImGuiColumns(&IStack_a8);
  iVar1 = (window->ColumnsStorage).Size;
  if (iVar1 == (window->ColumnsStorage).Capacity) {
    if (iVar1 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar1 / 2 + iVar1;
    }
    iVar5 = iVar1 + 1;
    if (iVar1 + 1 < iVar3) {
      iVar5 = iVar3;
    }
    pIVar2 = (ImGuiColumns *)MemAlloc((long)iVar5 * 0x88);
    __src = (window->ColumnsStorage).Data;
    if (__src != (ImGuiColumns *)0x0) {
      memcpy(pIVar2,__src,(long)(window->ColumnsStorage).Size * 0x88);
      MemFree((window->ColumnsStorage).Data);
    }
    (window->ColumnsStorage).Data = pIVar2;
    (window->ColumnsStorage).Capacity = iVar5;
    iVar1 = (window->ColumnsStorage).Size;
  }
  else {
    pIVar2 = (window->ColumnsStorage).Data;
  }
  memcpy(pIVar2 + iVar1,&IStack_a8,0x88);
  (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
  ImDrawListSplitter::ClearFreeMemory(&IStack_a8.Splitter);
  if (IStack_a8.Splitter._Channels.Data != (ImDrawChannel *)0x0) {
    MemFree(IStack_a8.Splitter._Channels.Data);
  }
  if (IStack_a8.Columns.Data != (ImGuiColumnData *)0x0) {
    MemFree(IStack_a8.Columns.Data);
  }
  iVar1 = (window->ColumnsStorage).Size;
  if (iVar1 < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
    iVar1 = (window->ColumnsStorage).Size;
  }
  pIVar2 = (window->ColumnsStorage).Data + (long)iVar1 + -1;
  pIVar2->ID = id;
  return pIVar2;
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}